

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O1

void __thiscall Potassco::SmodelsInput::matchSum(SmodelsInput *this,RuleBuilder *rule,bool weights)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Atom_t AVar5;
  WeightLit_t *pWVar6;
  undefined7 in_register_00000011;
  uint uVar7;
  long lVar8;
  bool bVar9;
  
  uVar2 = ProgramReader::matchPos(&this->super_ProgramReader,0xffffffff,"unsigned integer expected")
  ;
  uVar3 = ProgramReader::matchPos(&this->super_ProgramReader,0xffffffff,"unsigned integer expected")
  ;
  uVar4 = ProgramReader::matchPos(&this->super_ProgramReader,0xffffffff,"unsigned integer expected")
  ;
  uVar1 = uVar2;
  uVar7 = uVar4;
  if ((int)CONCAT71(in_register_00000011,weights) != 0) {
    uVar1 = uVar3;
    uVar7 = uVar2;
  }
  RuleBuilder::startSum(rule,uVar7);
  if (uVar1 != 0) {
    if (weights) {
      uVar3 = uVar4;
    }
    uVar7 = uVar1;
    do {
      AVar5 = ProgramReader::matchAtom(&this->super_ProgramReader,"atom expected");
      bVar9 = uVar3 == 0;
      uVar2 = -AVar5;
      uVar3 = uVar3 - 1;
      if (bVar9) {
        uVar2 = AVar5;
        uVar3 = 0;
      }
      RuleBuilder::addGoal(rule,(WeightLit_t)((ulong)uVar2 | 0x100000000));
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  if ((weights) && (pWVar6 = RuleBuilder::wlits_begin(rule), uVar1 != 0)) {
    lVar8 = 0;
    do {
      uVar7 = ProgramReader::matchPos
                        (&this->super_ProgramReader,0xffffffff,"non-negative weight expected");
      *(uint *)((long)&pWVar6->weight + lVar8) = uVar7;
      lVar8 = lVar8 + 8;
    } while ((ulong)uVar1 << 3 != lVar8);
  }
  return;
}

Assistant:

void SmodelsInput::matchSum(RuleBuilder& rule, bool weights) {
	uint32_t bnd = matchPos();
	uint32_t len = matchPos();
	uint32_t neg = matchPos();
	if (!weights) { std::swap(len, bnd); std::swap(bnd, neg); }
	rule.startSum(bnd);
	for (uint32_t i = 0; i != len; ++i) {
		Lit_t p = lit(matchAtom());
		if (neg) { p *= -1; --neg; }
		rule.addGoal(p, 1);
	}
	if (weights) {
		for (WeightLit_t* x = rule.wlits_begin(), *end = x + len; x != end; ++x) {
			x->weight = (Weight_t)matchPos("non-negative weight expected");
		}
	}
}